

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall Database::Close(Database *this)

{
  if (this->connected == true) {
    this->connected = false;
    if (this->engine == SQLite) {
      sqlite3_close(((this->impl)._M_t.
                     super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                     .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
      return;
    }
    if (this->engine == MySQL) {
      mysql_close(((this->impl)._M_t.
                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>.
                   super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
      return;
    }
  }
  return;
}

Assistant:

void Database::Close()
{
	if (!this->connected)
	{
		return;
	}

	this->connected = false;

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			mysql_close(this->impl->mysql_handle);
			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			sqlite3_close(this->impl->sqlite_handle);
			break;
#endif // DATABASE_SQLITE
	}
}